

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rnn.cc
# Opt level: O2

void __thiscall
cnn::SimpleRNNBuilder::start_new_sequence_impl
          (SimpleRNNBuilder *this,
          vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_> *h_0)

{
  long lVar1;
  
  std::
  vector<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>,_std::allocator<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>_>_>
  ::clear(&this->h);
  std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>::operator=
            (&this->h0,h_0);
  lVar1 = (long)(this->h0).
                super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>.
                _M_impl.super__Vector_impl_data._M_finish -
          (long)(this->h0).
                super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>.
                _M_impl.super__Vector_impl_data._M_start;
  if ((lVar1 != 0) && (lVar1 >> 4 != (ulong)this->layers)) {
    __assert_fail("h0.size() == layers",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/LeonCrashCode[P]LookAheadFeature/cnn/rnn.cc"
                  ,0x3f,
                  "virtual void cnn::SimpleRNNBuilder::start_new_sequence_impl(const vector<Expression> &)"
                 );
  }
  return;
}

Assistant:

void SimpleRNNBuilder::start_new_sequence_impl(const vector<Expression>& h_0) {
  h.clear();
  h0 = h_0;
  if (h0.size()) { assert(h0.size() == layers); }
}